

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

void __thiscall
QHstsCache::updateKnownHost
          (QHstsCache *this,QString *host,QDateTime *expires,bool includeSubDomains)

{
  bool bVar1;
  undefined1 in_CL;
  iterator in_RDX;
  QHstsPolicy *in_RSI;
  value_type *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_bool> pVar2;
  QHstsPolicy newPolicy;
  PolicyFlags flags;
  iterator pos;
  HostName hostName;
  undefined4 in_stack_ffffffffffffff28;
  PolicyFlag in_stack_ffffffffffffff2c;
  HostName *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined3 in_stack_ffffffffffffff44;
  uint uVar3;
  value_type *pvVar4;
  QFlagsStorage<QHstsPolicy::PolicyFlag> flags_00;
  _Self local_68;
  undefined4 local_5c;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  _Self local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffff44) & 0x1ffffff;
  pvVar4 = in_RDI;
  bVar1 = is_valid_domain_name
                    ((QString *)
                     (CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffff44),in_stack_ffffffffffffff40)
                     & 0x1ffffffffffffff));
  flags_00.i = (Int)((ulong)pvVar4 >> 0x20);
  if (!bVar1) goto LAB_001796f3;
  memset(&local_40,0,0x28);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  HostName::HostName(&in_RDI->first,
                     (QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_48._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
       ::find((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
               *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),(key_type *)0x1794e1)
  ;
  local_4c = 0xaaaaaaaa;
  QFlags<QHstsPolicy::PolicyFlag>::QFlags((QFlags<QHstsPolicy::PolicyFlag> *)0x179503);
  if ((uVar3 & 0x1000000) != 0) {
    QFlags<QHstsPolicy::PolicyFlag>::QFlags
              ((QFlags<QHstsPolicy::PolicyFlag> *)in_RDI,in_stack_ffffffffffffff2c);
    local_4c = local_50;
  }
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_5c = local_4c;
  QHstsPolicy::QHstsPolicy
            (in_RSI,(QDateTime *)in_RDX._M_node,(PolicyFlags)flags_00.i,
             (QString *)CONCAT44(uVar3,in_stack_ffffffffffffff40),
             (ParsingMode)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  local_68._M_node =
       (_Base_ptr)
       std::
       map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
       ::end((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
              *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = std::operator==(&local_48,&local_68);
  if (bVar1) {
    bVar1 = QHstsPolicy::isExpired((QHstsPolicy *)in_RDX._M_node);
    if (!bVar1) {
      std::pair<const_QHstsCache::HostName,_QHstsPolicy>::
      pair<const_QHstsCache::HostName,_QHstsPolicy,_true>
                ((pair<const_QHstsCache::HostName,_QHstsPolicy> *)
                 CONCAT44(uVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
                 (QHstsPolicy *)in_RDI);
      pVar2 = std::
              map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
              ::insert((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                        *)in_stack_ffffffffffffff38,in_RDI);
      local_18 = (_Base_ptr)pVar2.first._M_node;
      local_10 = pVar2.second;
      std::pair<const_QHstsCache::HostName,_QHstsPolicy>::~pair(in_RDI);
      if (in_RDI[1].first.name.d.d != (Data *)0x0) {
        QHstsStore::addToObserved
                  ((QHstsStore *)in_RDI,
                   (QHstsPolicy *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
    }
  }
  else {
    bVar1 = QHstsPolicy::isExpired((QHstsPolicy *)in_RDX._M_node);
    if (bVar1) {
      std::
      map<QHstsCache::HostName,QHstsPolicy,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
      ::erase_abi_cxx11_((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                          *)in_RDI,in_RDX);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_> *)0x179666)
      ;
      bVar1 = ::operator!=((QHstsPolicy *)in_RDI,
                           (QHstsPolicy *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (!bVar1) goto LAB_001796d9;
      std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_> *)0x17968d)
      ;
      QHstsPolicy::operator=
                ((QHstsPolicy *)in_RDI,
                 (QHstsPolicy *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    if (in_RDI[1].first.name.d.d != (Data *)0x0) {
      QHstsStore::addToObserved
                ((QHstsStore *)in_RDI,
                 (QHstsPolicy *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
  }
LAB_001796d9:
  QHstsPolicy::~QHstsPolicy((QHstsPolicy *)0x1796e6);
  HostName::~HostName((HostName *)0x1796f3);
LAB_001796f3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHstsCache::updateKnownHost(const QString &host, const QDateTime &expires,
                                 bool includeSubDomains)
{
    if (!is_valid_domain_name(host))
        return;

    // HSTS is a per-host policy, regardless of protocol, port or any of the other
    // details in an URL; so we only want the host part.  QUrl::host handles
    // IDNA 2003 (RFC3490) for us, as required by HSTS (RFC6797, section 10).
    const HostName hostName(host);
    const auto pos = knownHosts.find(hostName);
    QHstsPolicy::PolicyFlags flags;
    if (includeSubDomains)
        flags = QHstsPolicy::IncludeSubDomains;

    const QHstsPolicy newPolicy(expires, flags, hostName.name);
    if (pos == knownHosts.end()) {
        // A new, previously unknown host.
        if (newPolicy.isExpired()) {
            // Nothing to do at all - we did not know this host previously,
            // we do not have to - since its policy expired.
            return;
        }

        knownHosts.insert({hostName, newPolicy});
#if QT_CONFIG(settings)
        if (hstsStore)
            hstsStore->addToObserved(newPolicy);
#endif // QT_CONFIG(settings)
        return;
    }

    if (newPolicy.isExpired())
        knownHosts.erase(pos);
    else  if (pos->second != newPolicy)
        pos->second = newPolicy;
    else
        return;

#if QT_CONFIG(settings)
    if (hstsStore)
        hstsStore->addToObserved(newPolicy);
#endif // QT_CONFIG(settings)
}